

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

QObject * __thiscall QFactoryLoader::instance(QFactoryLoader *this,int index)

{
  QObject *pQVar1;
  QThread *pQVar2;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (index < 0) {
    pQVar1 = (QObject *)0x0;
  }
  else {
    local_28._0_8_ = &(this->d).mutex;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
    local_28[8] = true;
    pQVar1 = instanceHelper_locked(this,index);
    if ((pQVar1 != (QObject *)0x0) && (((pQVar1->d_ptr).d)->parent == (QObject *)0x0)) {
      pQVar2 = QCoreApplicationPrivate::mainThread();
      QObject::moveToThread(pQVar1,pQVar2);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QObject *QFactoryLoader::instance(int index) const
{
    if (index < 0)
        return nullptr;

    QMutexLocker lock(&d->mutex);
    QObject *obj = instanceHelper_locked(index);

    if (obj && !obj->parent())
        obj->moveToThread(QCoreApplicationPrivate::mainThread());
    return obj;
}